

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-hmac-impl.c
# Opt level: O0

void ndn_lite_default_hmac_load_backend(void)

{
  ndn_hmac_backend_t *pnVar1;
  ndn_hmac_backend_t *backend;
  
  pnVar1 = ndn_hmac_get_backend();
  pnVar1->get_key_size = ndn_lite_default_hmac_get_key_size;
  pnVar1->get_key_value = ndn_lite_default_hmac_get_key_value;
  pnVar1->load_key = ndn_lite_default_hmac_load_key;
  pnVar1->hmac_sha256_init = ndn_lite_default_hmac_sha256_init;
  pnVar1->hmac_sha256_update = ndn_lite_default_hmac_sha256_update;
  pnVar1->hmac_sha256_final = ndn_lite_default_hmac_sha256_final;
  pnVar1->hmacprng = ndn_lite_default_hmacprng;
  return;
}

Assistant:

void
ndn_lite_default_hmac_load_backend(void)
{
  ndn_hmac_backend_t* backend = ndn_hmac_get_backend();
  backend->get_key_size = ndn_lite_default_hmac_get_key_size;
  backend->get_key_value = ndn_lite_default_hmac_get_key_value;
  backend->load_key = ndn_lite_default_hmac_load_key;
  backend->hmac_sha256_init = ndn_lite_default_hmac_sha256_init;
  backend->hmac_sha256_update = ndn_lite_default_hmac_sha256_update;
  backend->hmac_sha256_final = ndn_lite_default_hmac_sha256_final;
  backend->hmacprng = ndn_lite_default_hmacprng;
}